

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cc
# Opt level: O3

InputGraph __thiscall
anon_unknown.dwarf_1cd2a1::read_csv
          (anon_unknown_dwarf_1cd2a1 *this,istream *infile,string *filename,
          optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *rename_map)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  anon_unknown_dwarf_1cd2a1 *this_00;
  pointer ptVar3;
  char cVar4;
  istream *piVar5;
  void *pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  const_iterator cVar8;
  _Hash_node_base *p_Var9;
  mapped_type *pmVar10;
  InputGraph extraout_RAX_00;
  GraphFileError *pGVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  int iVar13;
  pointer ptVar14;
  int a;
  long lVar15;
  bool e;
  iterator __begin2;
  _Hash_node_base *p_Var16;
  ulong uVar17;
  size_type __n;
  key_type *__k;
  bool bVar18;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar19;
  string_view label_00;
  string_view label_01;
  string_view l;
  string_view l_00;
  int right_idx;
  int left_idx;
  string label;
  string left;
  string line;
  string right;
  vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  edges;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertices;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertex_labels;
  int local_190;
  int local_18c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined8 local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string *local_e0;
  anon_unknown_dwarf_1cd2a1 *local_d8;
  ulong local_d0;
  vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  undefined1 local_a8 [32];
  float local_88;
  size_t local_80;
  __node_base_ptr p_Stack_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  lVar15 = *(long *)(*(long *)infile + -0x18);
  local_d8 = this;
  if (((byte)infile[lVar15 + 0x20] & 5) != 0) {
    pGVar11 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"error opening file","");
    GraphFileError::GraphFileError(pGVar11,filename,(string *)local_a8,false);
    __cxa_throw(pGVar11,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  local_a8._0_8_ = &p_Stack_78;
  local_68._M_buckets = &local_68._M_single_bucket;
  e = false;
  local_d0 = 0;
  local_108 = 0;
  local_a8._8_8_ = 1;
  local_68._M_bucket_count = 1;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_88 = 1.0;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_80 = 0;
  p_Stack_78 = (__node_base_ptr)0x0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_c8.
  super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_e0 = filename;
  local_70 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)rename_map;
  while( true ) {
    paVar7 = &local_188.field_2;
    cVar4 = std::ios::widen((char)lVar15 + (char)infile);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (infile,(string *)&local_148,cVar4);
    this_00 = local_d8;
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    if (local_148._M_string_length == 0) {
LAB_0013b9e3:
      pGVar11 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"expected a comma but didn\'t get one","");
      GraphFileError::GraphFileError(pGVar11,local_e0,&local_168,true);
      __cxa_throw(pGVar11,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    uVar17 = 0;
    while ((local_148._M_dataplus._M_p[uVar17] != ',' && (local_148._M_dataplus._M_p[uVar17] != '>')
           )) {
      uVar17 = uVar17 + 1;
      if (local_148._M_string_length == uVar17) goto LAB_0013b9e3;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_168,&local_148,0,uVar17);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_128,&local_148,uVar17 + 1,0xffffffffffffffff);
    _Var2._M_p = local_128._M_dataplus._M_p;
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    if (local_148._M_string_length <= uVar17) {
      local_188._M_dataplus._M_p = (pointer)paVar7;
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar17);
    }
    cVar4 = local_148._M_dataplus._M_p[uVar17];
    if (local_128._M_string_length == 0) {
      local_188._M_dataplus._M_p = (pointer)paVar7;
      if (local_168._M_string_length == 0) goto LAB_0013b5b5;
LAB_0013b663:
      local_100._M_dataplus._M_p = (pointer)local_a8._24_8_;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,unsigned_long>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_a8,&local_168,&local_100);
    }
    else {
      local_188._M_dataplus._M_p = (pointer)paVar7;
      pvVar6 = memchr(local_128._M_dataplus._M_p,0x2c,local_128._M_string_length);
      __n = (long)pvVar6 - (long)_Var2._M_p;
      if (__n != 0xffffffffffffffff && pvVar6 != (void *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_100,&local_128,__n + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_188,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_100,&local_128,0,__n);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_128,&local_100);
        paVar7 = &local_100.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar7) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          paVar7 = extraout_RAX;
        }
        if ((local_128._M_string_length == 0) && (local_168._M_string_length != 0)) {
          if (local_188._M_string_length != 0) {
            local_108 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&local_68,&local_168,&local_188);
          }
          goto LAB_0013b663;
        }
      }
LAB_0013b5b5:
      local_100._M_dataplus._M_p = (pointer)local_a8._24_8_;
      pVar19 = std::
               _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::__cxx11::string&,unsigned_long>
                         ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)local_a8,&local_168,&local_100);
      local_18c = *(int *)((long)pVar19.first.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                 ._M_cur.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          + 0x28);
      local_100._M_dataplus._M_p = (pointer)local_a8._24_8_;
      pVar19 = std::
               _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::__cxx11::string&,unsigned_long>
                         ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)local_a8,&local_128,&local_100);
      bVar18 = local_188._M_string_length != 0;
      local_190 = *(int *)((long)pVar19.first.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                 ._M_cur.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          + 0x28);
      if (cVar4 == '>') {
        local_d0 = CONCAT71((uint7)(uint3)((uint)local_190 >> 8),1);
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
                    *)&local_c8,&local_18c,&local_190,&local_188);
      }
      else {
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
                    *)&local_c8,&local_18c,&local_190,&local_188);
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
                    *)&local_c8,&local_190,&local_18c,&local_188);
      }
      e = (bool)(e | bVar18);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    lVar15 = *(long *)(*(long *)infile + -0x18);
  }
  InputGraph::InputGraph((InputGraph *)local_d8,local_a8._24_4_,(bool)((byte)local_108 & 1),e);
  ptVar3 = local_c8.
           super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar17 = local_d0;
  ptVar14 = local_c8.
            super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var16 = (_Hash_node_base *)local_a8._16_8_;
  do {
    local_a8._16_8_ = p_Var16;
    if (ptVar14 == ptVar3) {
      if (p_Var16 != (_Hash_node_base *)0x0) {
        do {
          iVar13 = *(int *)&p_Var16[5]._M_nxt;
          __k = (key_type *)(p_Var16 + 1);
          if (*(char *)&local_70[1]._M_buckets == '\x01') {
            cVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(local_70,__k);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              pGVar11 = (GraphFileError *)__cxa_allocate_exception(0x30);
              std::operator+(&local_128,"did not find a name for vertex \'",__k);
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_128,"\'");
              paVar7 = &pbVar12->field_2;
              local_168._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p == paVar7) {
                local_168.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              }
              else {
                local_168.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              }
              local_168._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar7;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              GraphFileError::GraphFileError(pGVar11,local_e0,&local_168,true);
              __cxa_throw(pGVar11,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
            }
            __k = (key_type *)
                  ((long)cVar8.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         ._M_cur + 0x28);
            p_Var9 = (_Hash_node_base *)
                     ((long)cVar8.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x30);
          }
          else {
            p_Var9 = p_Var16 + 2;
          }
          pcVar1 = (__k->_M_dataplus)._M_p;
          local_188._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_188,pcVar1,pcVar1 + (long)&p_Var9->_M_nxt->_M_nxt);
          l._M_str = local_188._M_dataplus._M_p;
          l._M_len = local_188._M_string_length;
          InputGraph::set_vertex_name((InputGraph *)this_00,iVar13,l);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar7) {
            operator_delete(local_188._M_dataplus._M_p,
                            CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                     local_188.field_2._M_local_buf[0]) + 1);
          }
          p_Var16 = p_Var16->_M_nxt;
        } while (p_Var16 != (_Hash_node_base *)0x0);
        if (((byte)local_108 & (_Hash_node_base *)local_a8._16_8_ != (_Hash_node_base *)0x0) == 1) {
          p_Var16 = (_Hash_node_base *)local_a8._16_8_;
          do {
            iVar13 = *(int *)&p_Var16[5]._M_nxt;
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_68,(key_type *)(p_Var16 + 1));
            l_00._M_str = (pmVar10->_M_dataplus)._M_p;
            l_00._M_len = pmVar10->_M_string_length;
            InputGraph::set_vertex_label((InputGraph *)this_00,iVar13,l_00);
            p_Var16 = p_Var16->_M_nxt;
          } while (p_Var16 != (_Hash_node_base *)0x0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_c8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_a8);
      return (InputGraph)
             extraout_RAX_00._imp._M_t.
             super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
             super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
             super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
    }
    iVar13 = (ptVar14->
             super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Head_base<1UL,_int,_false>._M_head_impl;
    a = *(int *)&(ptVar14->
                 super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).
                 super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0x24;
    if ((uVar17 & 1) == 0) {
      if (e != false) {
        label_00._M_str =
             (ptVar14->
             super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p;
        label_00._M_len =
             (ptVar14->
             super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_string_length;
        InputGraph::add_directed_edge((InputGraph *)this_00,a,iVar13,label_00);
        a = (ptVar14->
            super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).
            super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Head_base<1UL,_int,_false>._M_head_impl;
        iVar13 = *(int *)&(ptVar14->
                          super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).
                          super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0x24;
        goto LAB_0013b881;
      }
      InputGraph::add_edge((InputGraph *)this_00,a,iVar13);
    }
    else {
LAB_0013b881:
      label_01._M_str =
           (ptVar14->
           super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p;
      label_01._M_len =
           (ptVar14->
           super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_string_length;
      InputGraph::add_directed_edge((InputGraph *)this_00,a,iVar13,label_01);
    }
    ptVar14 = ptVar14 + 1;
    p_Var16 = (_Hash_node_base *)local_a8._16_8_;
  } while( true );
}

Assistant:

auto read_csv(istream && infile, const string & filename, const optional<unordered_map<string, string>> & rename_map) -> InputGraph
    {
        if (! infile)
            throw GraphFileError{filename, "error opening file", false};

        unordered_map<string, int> vertices;
        unordered_map<string, string> vertex_labels;
        vector<tuple<int, int, string>> edges;
        bool seen_vertex_label = false, seen_edge_label = false, seen_directed_edge = false;

        string line;

        while (getline(infile, line)) {
            auto pos = line.find_first_of(",>");
            if (string::npos == pos)
                throw GraphFileError{filename, "expected a comma but didn't get one", true};

            string left = line.substr(0, pos), right = line.substr(pos + 1), label;
            char delim = line.at(pos);

            auto pos2 = right.find(',');
            if (string::npos != pos2) {
                label = right.substr(pos2 + 1);
                right = right.substr(0, pos2);
            }

            if (right.empty() && ! left.empty()) {
                if (! label.empty()) {
                    seen_vertex_label = true;
                    vertex_labels.emplace(left, label);
                }

                vertices.emplace(left, vertices.size());
            }
            else {
                int left_idx = vertices.emplace(left, vertices.size()).first->second;
                int right_idx = vertices.emplace(right, vertices.size()).first->second;

                if (! label.empty())
                    seen_edge_label = true;

                if (delim == '>') {
                    seen_directed_edge = true;
                    edges.emplace_back(left_idx, right_idx, label);
                }
                else {
                    edges.emplace_back(left_idx, right_idx, label);
                    edges.emplace_back(right_idx, left_idx, label);
                }
            }
        }

        InputGraph result{int(vertices.size()), seen_vertex_label, seen_edge_label};

        for (auto & [f, t, l] : edges)
            if (seen_directed_edge)
                result.add_directed_edge(f, t, l);
            else if (seen_edge_label) {
                result.add_directed_edge(f, t, l);
                result.add_directed_edge(t, f, l);
            }
            else
                result.add_edge(f, t);

        auto rename = [&](const string & s) -> string {
            if (rename_map) {
                auto r = rename_map->find(s);
                if (r == rename_map->end())
                    throw GraphFileError{filename, "did not find a name for vertex '" + s + "'", true};
                return r->second;
            }
            else
                return s;
        };

        for (auto & [v, l] : vertices)
            result.set_vertex_name(l, rename(v));

        if (seen_vertex_label)
            for (auto & [v, l] : vertices)
                result.set_vertex_label(l, vertex_labels[v]);

        return result;
    }